

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  _List_node_base **pp_Var4;
  int iVar5;
  PoolAllocatorPrivate *pPVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  void *ptr;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  pPVar6 = this->d;
  p_Var7 = (pPVar6->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var9 = p_Var7;
  p_Var8 = p_Var7;
  p_Var2 = (_List_node_base *)size;
  if (p_Var7 != (_List_node_base *)&pPVar6->budgets) {
    do {
      local_40 = p_Var2;
      p_Var2 = p_Var9[1]._M_next;
      if ((p_Var2 < size) ||
         (size < (_List_node_base *)((ulong)pPVar6->size_compare_ratio * (long)p_Var2 >> 8))) {
        if (p_Var2 < p_Var7[1]._M_next) {
          p_Var7 = p_Var9;
        }
        if (p_Var8[1]._M_next < p_Var2) {
          p_Var8 = p_Var9;
        }
        bVar3 = true;
      }
      else {
        local_50 = p_Var9[1]._M_prev;
        psVar1 = &(pPVar6->budgets).
                  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var9,0x20);
        pthread_mutex_unlock((pthread_mutex_t *)this->d);
        pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
        pPVar6 = this->d;
        local_38 = p_Var7;
        p_Var7 = (_List_node_base *)operator_new(0x20);
        size = (size_t)local_40;
        p_Var7[1]._M_next = p_Var2;
        p_Var7[1]._M_prev = local_50;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        p_Var7 = local_38;
        psVar1 = &(pPVar6->payouts).
                  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
        bVar3 = false;
      }
      if (!bVar3) {
        return local_50;
      }
      pp_Var4 = &p_Var9->_M_next;
      pPVar6 = this->d;
      p_Var9 = *pp_Var4;
      p_Var2 = local_40;
    } while (*pp_Var4 != (_List_node_base *)&pPVar6->budgets);
  }
  if (pPVar6->size_drop_threshold <=
      (pPVar6->budgets).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node._M_size) {
    if (p_Var8[1]._M_next < size) {
      p_Var9 = p_Var7[1]._M_prev;
      p_Var8 = p_Var7;
    }
    else {
      if (p_Var7[1]._M_next <= size) goto LAB_00175aa5;
      p_Var9 = p_Var8[1]._M_prev;
    }
    if (p_Var9 != (_List_node_base *)0x0) {
      free(p_Var9);
    }
    psVar1 = &(this->d->budgets).
              super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var8,0x20);
  }
LAB_00175aa5:
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  local_48 = (_List_node_base *)0x0;
  iVar5 = posix_memalign(&local_48,0x40,(size_t)(size + 0x40));
  if (iVar5 != 0) {
    local_48 = (_List_node_base *)0x0;
  }
  p_Var7 = local_48;
  pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
  pPVar6 = this->d;
  p_Var8 = (_List_node_base *)operator_new(0x20);
  p_Var8[1]._M_next = (_List_node_base *)size;
  p_Var8[1]._M_prev = p_Var7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(pPVar6->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
  return p_Var7;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }

        if (bs < it_min->first)
        {
            it_min = it;
        }
        if (bs > it_max->first)
        {
            it_max = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        // All chunks in pool are not chosen. Then try to drop some outdated
        // chunks and return them to OS.
        if (it_max->first < size)
        {
            // Current query is asking for a chunk larger than any cached chunks.
            // Then remove the smallest one.
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            // Current query is asking for a chunk smaller than any cached chunks.
            // Then remove the largest one.
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}